

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_impl.cc
# Opt level: O2

int32_t __thiscall
webrtc::TraceImpl::SetTraceFileImpl(TraceImpl *this,char *file_name_utf8,bool add_file_counter)

{
  scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_> *this_00;
  int iVar1;
  element_type *peVar2;
  TraceImpl *this_01;
  int32_t iVar3;
  CritScope lock;
  char file_name_with_counter_utf8 [1024];
  
  rtc::CritScope::CritScope(&lock,&this->crit_);
  this_00 = &this->trace_file_;
  peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
           operator->(this_00);
  (*(peVar2->super_InStream)._vptr_InStream[9])(peVar2);
  this_01 = (TraceImpl *)
            rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
            operator->(this_00);
  (*((InStream *)&this_01->_vptr_TraceImpl)->_vptr_InStream[7])();
  if (file_name_utf8 != (char *)0x0) {
    if (add_file_counter) {
      this->file_count_text_ = 1;
      CreateFileName(this_01,file_name_utf8,file_name_with_counter_utf8,1);
      peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
               operator->(this_00);
      iVar1 = (*(peVar2->super_InStream)._vptr_InStream[5])
                        (peVar2,file_name_with_counter_utf8,0,0,1);
    }
    else {
      this->file_count_text_ = 0;
      peVar2 = rtc::scoped_ptr<webrtc::FileWrapper,_rtc::DefaultDeleter<webrtc::FileWrapper>_>::
               operator->(this_00);
      iVar1 = (*(peVar2->super_InStream)._vptr_InStream[5])(peVar2,file_name_utf8,0,0,1);
    }
    if (iVar1 == -1) {
      iVar3 = -1;
      goto LAB_0018fc74;
    }
  }
  this->row_count_text_ = 0;
  iVar3 = 0;
LAB_0018fc74:
  rtc::CritScope::~CritScope(&lock);
  return iVar3;
}

Assistant:

int32_t TraceImpl::SetTraceFileImpl(const char* file_name_utf8,
                                    const bool add_file_counter) {
  rtc::CritScope lock(&crit_);

  trace_file_->Flush();
  trace_file_->CloseFile();

  if (file_name_utf8) {
    if (add_file_counter) {
      file_count_text_ = 1;

      char file_name_with_counter_utf8[FileWrapper::kMaxFileNameSize];
      CreateFileName(file_name_utf8, file_name_with_counter_utf8,
                     file_count_text_);
      if (trace_file_->OpenFile(file_name_with_counter_utf8, false, false,
                               true) == -1) {
        return -1;
      }
    } else {
      file_count_text_ = 0;
      if (trace_file_->OpenFile(file_name_utf8, false, false, true) == -1) {
        return -1;
      }
    }
  }
  row_count_text_ = 0;
  return 0;
}